

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

Dim * __thiscall
cnn::FoldRows::dim_forward(FoldRows *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  int iVar1;
  initializer_list<unsigned_int> x;
  uint uVar2;
  uint uVar3;
  const_reference pvVar4;
  size_type sVar5;
  ostream *this_00;
  invalid_argument *this_01;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  ostream *in_RSI;
  Dim *in_RDI;
  uint orows;
  
  pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar2 = Dim::rows(pvVar4);
  uVar2 = uVar2 / *(uint *)(in_RSI + 0x50);
  iVar1 = *(int *)(in_RSI + 0x50);
  pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar3 = Dim::rows(pvVar4);
  if (uVar2 * iVar1 == uVar3) {
    sVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
    if (sVar5 == 1) {
      pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      uVar3 = Dim::ndims(pvVar4);
      if (uVar3 == 2) {
        pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
        uVar3 = Dim::cols(pvVar4);
        x._M_len = 2;
        x._M_array = (iterator)&stack0xffffffffffffffc0;
        Dim::Dim((Dim *)CONCAT44(uVar3,uVar2),x);
        return in_RDI;
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad input dimensions in FoldRows: ");
  this_00 = cnn::operator<<(in_RSI,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)in_RDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"bad input dimensions in FoldRows");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim FoldRows::dim_forward(const vector<Dim>& xs) const {
  unsigned orows = xs[0].rows() / nrows;
  if ((orows * nrows != xs[0].rows()) || xs.size() != 1 || xs[0].ndims() != 2) {
    cerr << "Bad input dimensions in FoldRows: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in FoldRows");
  }
  return Dim({orows, xs[0].cols()});
}